

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

bool __thiscall ON_Font::SetWindowsLogfontWeight(ON_Font *this,int windows_logfont_weight)

{
  Weight font_weight_00;
  bool bVar1;
  Weight font_weight;
  int windows_logfont_weight_local;
  ON_Font *this_local;
  
  font_weight_00 = WeightFromWindowsLogfontWeight(windows_logfont_weight);
  bVar1 = Internal_SetFontWeightTrio
                    (this,font_weight_00,windows_logfont_weight,-1.23432101234321e+308,
                     windows_logfont_weight != this->m_windows_logfont_weight);
  return bVar1;
}

Assistant:

bool ON_Font::SetWindowsLogfontWeight(
  int windows_logfont_weight
)
{
  const ON_Font::Weight font_weight = ON_Font::WeightFromWindowsLogfontWeight(windows_logfont_weight);
  return Internal_SetFontWeightTrio(
    font_weight, 
    windows_logfont_weight, 
    ON_UNSET_VALUE,
    windows_logfont_weight != m_windows_logfont_weight
  );
}